

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::Reset
          (HeapBuffered<perfetto::protos::pbzero::TracePacket> *this)

{
  HeapBuffered<perfetto::protos::pbzero::TracePacket> *this_local;
  
  ScatteredHeapBuffer::Reset(&this->shb_);
  ScatteredStreamWriter::Reset(&this->writer_,(ContiguousMemoryRange)ZEXT816(0));
  RootMessage<perfetto::protos::pbzero::TracePacket>::Reset(&this->msg_,&this->writer_);
  return;
}

Assistant:

void Reset() {
    shb_.Reset();
    writer_.Reset(protozero::ContiguousMemoryRange{});
    msg_.Reset(&writer_);
    PERFETTO_DCHECK(empty());
  }